

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolPartialJPolValPair.cpp
# Opt level: O1

void __thiscall
PolicyPoolPartialJPolValPair::~PolicyPoolPartialJPolValPair(PolicyPoolPartialJPolValPair *this)

{
  ~PolicyPoolPartialJPolValPair(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

PolicyPoolPartialJPolValPair::~PolicyPoolPartialJPolValPair()
{
    while(_m_jpvpQueue_p->size() > 0)
    {
//        delete _m_jpvpQueue_p->top();
        _m_jpvpQueue_p->pop();
    }
    delete _m_jpvpQueue_p;
}